

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeLiteral(ParsedPatternInfo *this,UErrorCode *status)

{
  UChar32 UVar1;
  ParserState *this_00;
  
  this_00 = &this->state;
  UVar1 = ParserState::peek(this_00);
  if (UVar1 != -1) {
    UVar1 = ParserState::peek(this_00);
    ParserState::next(this_00);
    if (UVar1 != 0x27) {
      return;
    }
    while( true ) {
      UVar1 = ParserState::peek(this_00);
      if (UVar1 == 0x27) {
        ParserState::next(this_00);
        return;
      }
      UVar1 = ParserState::peek(this_00);
      if (UVar1 == -1) break;
      ParserState::next(this_00);
    }
  }
  *status = U_PATTERN_SYNTAX_ERROR;
  return;
}

Assistant:

void ParsedPatternInfo::consumeLiteral(UErrorCode& status) {
    if (state.peek() == -1) {
        state.toParseException(u"Expected unquoted literal but found EOL");
        status = U_PATTERN_SYNTAX_ERROR;
        return;
    } else if (state.peek() == u'\'') {
        state.next(); // consume the starting quote
        while (state.peek() != u'\'') {
            if (state.peek() == -1) {
                state.toParseException(u"Expected quoted literal but found EOL");
                status = U_PATTERN_SYNTAX_ERROR;
                return;
            } else {
                state.next(); // consume a quoted character
            }
        }
        state.next(); // consume the ending quote
    } else {
        // consume a non-quoted literal character
        state.next();
    }
}